

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O3

void __thiscall
ODDLParser::OpenDDLParserTest_parsePrimitiveDataTypeWithArrayTest_Test::
~OpenDDLParserTest_parsePrimitiveDataTypeWithArrayTest_Test
          (OpenDDLParserTest_parsePrimitiveDataTypeWithArrayTest_Test *this)

{
  pointer ppVVar1;
  
  (this->super_OpenDDLParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__OpenDDLParserTest_0018aff0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_OpenDDLParserTest).m_logs);
  ppVVar1 = (this->super_OpenDDLParserTest).m_data.
            super__Vector_base<ODDLParser::Value_*,_std::allocator<ODDLParser::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar1 != (pointer)0x0) {
    operator_delete(ppVVar1,(long)(this->super_OpenDDLParserTest).m_data.
                                  super__Vector_base<ODDLParser::Value_*,_std::allocator<ODDLParser::Value_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar1
                   );
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parsePrimitiveDataTypeWithArrayTest) {
    size_t len1(0);
    char token[] = "float[3]", *end(findEnd(token, len1));

    Value::ValueType type;
    size_t arrayLen(0);

    char *in = OpenDDLParser::parsePrimitiveDataType(token, end, type, arrayLen);
    EXPECT_EQ(Value::ValueType::ddl_float, type);
    EXPECT_EQ(3U, arrayLen);
    EXPECT_NE(in, token);
}